

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# padding_pack4.h
# Opt level: O3

void ncnn::padding_reflect_pack4_sse(Mat *src,Mat *dst,int top,int bottom,int left,int right)

{
  long lVar1;
  int *piVar2;
  size_t *psVar3;
  ulong uVar4;
  int iVar5;
  int iVar6;
  ulong uVar7;
  ulong uVar8;
  long lVar9;
  size_t *psVar10;
  int iVar11;
  
  iVar6 = src->w;
  psVar3 = (size_t *)((long)(top * iVar6 * 4) * 4 + (long)src->data);
  uVar7 = (ulong)(uint)left;
  uVar8 = (ulong)(uint)right;
  if (0 < top) {
    iVar5 = 0;
    do {
      lVar9 = uVar7 << 4;
      if (0 < left) {
        do {
          piVar2 = (int *)((undefined8 *)((long)psVar3 + lVar9))[1];
          dst->data = *(void **)((long)psVar3 + lVar9);
          dst->refcount = piVar2;
          dst = (Mat *)&dst->elemsize;
          lVar9 = lVar9 + -0x10;
        } while (lVar9 != 0);
        iVar6 = src->w;
      }
      psVar10 = psVar3;
      if (0 < iVar6) {
        iVar11 = 0;
        do {
          piVar2 = (int *)psVar10[1];
          dst->data = (void *)*psVar10;
          dst->refcount = piVar2;
          psVar10 = psVar10 + 2;
          dst = (Mat *)&dst->elemsize;
          iVar11 = iVar11 + 1;
          iVar6 = src->w;
        } while (iVar11 < iVar6);
      }
      if (0 < right) {
        lVar9 = -0x20;
        do {
          piVar2 = (int *)((undefined8 *)((long)psVar10 + lVar9))[1];
          dst->data = *(Allocator **)((long)psVar10 + lVar9);
          dst->refcount = piVar2;
          dst = (Mat *)&dst->elemsize;
          lVar1 = uVar8 * 0x10 + lVar9;
          lVar9 = lVar9 + -0x10;
        } while (lVar1 != -0x10);
        iVar6 = src->w;
      }
      psVar3 = (size_t *)((long)psVar3 + (long)(iVar6 * 4) * -4);
      iVar5 = iVar5 + 1;
    } while (iVar5 != top);
  }
  if (0 < src->h) {
    iVar6 = 0;
    do {
      lVar9 = uVar7 << 4;
      if (0 < left) {
        do {
          piVar2 = (int *)((undefined8 *)((long)psVar3 + lVar9))[1];
          dst->data = *(void **)((long)psVar3 + lVar9);
          dst->refcount = piVar2;
          dst = (Mat *)&dst->elemsize;
          lVar9 = lVar9 + -0x10;
        } while (lVar9 != 0);
      }
      if (0 < src->w) {
        iVar5 = 0;
        do {
          piVar2 = (int *)psVar3[1];
          dst->data = (Allocator *)*psVar3;
          dst->refcount = piVar2;
          psVar3 = psVar3 + 2;
          dst = (Mat *)&dst->elemsize;
          iVar5 = iVar5 + 1;
        } while (iVar5 < src->w);
      }
      if (0 < right) {
        lVar9 = -0x20;
        do {
          piVar2 = (int *)((size_t *)((long)psVar3 + lVar9))[1];
          dst->data = *(void **)((long)psVar3 + lVar9);
          dst->refcount = piVar2;
          dst = (Mat *)&dst->elemsize;
          lVar1 = uVar8 * 0x10 + lVar9;
          lVar9 = lVar9 + -0x10;
        } while (lVar1 != -0x10);
      }
      iVar6 = iVar6 + 1;
    } while (iVar6 < src->h);
  }
  if (0 < bottom) {
    uVar4 = (ulong)src->w;
    psVar3 = psVar3 + uVar4 * -4;
    iVar6 = 0;
    do {
      lVar9 = uVar7 << 4;
      if (0 < left) {
        do {
          piVar2 = (int *)((undefined8 *)((long)psVar3 + lVar9))[1];
          dst->data = *(void **)((long)psVar3 + lVar9);
          dst->refcount = piVar2;
          dst = (Mat *)&dst->elemsize;
          lVar9 = lVar9 + -0x10;
        } while (lVar9 != 0);
        uVar4 = (ulong)(uint)src->w;
      }
      psVar10 = psVar3;
      if (0 < (int)uVar4) {
        iVar5 = 0;
        do {
          piVar2 = (int *)psVar10[1];
          dst->data = (void *)*psVar10;
          dst->refcount = piVar2;
          psVar10 = psVar10 + 2;
          dst = (Mat *)&dst->elemsize;
          iVar5 = iVar5 + 1;
          uVar4 = (ulong)(uint)src->w;
        } while (iVar5 < src->w);
      }
      if (0 < right) {
        lVar9 = -0x20;
        do {
          piVar2 = (int *)((undefined8 *)((long)psVar10 + lVar9))[1];
          dst->data = *(Allocator **)((long)psVar10 + lVar9);
          dst->refcount = piVar2;
          dst = (Mat *)&dst->elemsize;
          lVar1 = uVar8 * 0x10 + lVar9;
          lVar9 = lVar9 + -0x10;
        } while (lVar1 != -0x10);
        uVar4 = (ulong)(uint)src->w;
      }
      psVar3 = (size_t *)((long)psVar3 + (long)((int)uVar4 * 4) * -4);
      iVar6 = iVar6 + 1;
    } while (iVar6 != bottom);
  }
  return;
}

Assistant:

static void padding_reflect_pack4_sse(const Mat& src, Mat& dst, int top, int bottom, int left, int right)
{
    const float* ptr = src;
    float* outptr = dst;

    // fill top
    ptr += top * src.w * 4;
    for (int y = 0; y < top; y++)
    {
        const float* ptr0 = ptr;
        for (int x = 0; x < left; x++)
        {
            __m128 _p = _mm_load_ps(ptr0 + (left - x) * 4);
            _mm_store_ps(outptr, _p);
            outptr += 4;
        }
        for (int x = 0; x < src.w; x++)
        {
            __m128 _p = _mm_load_ps(ptr0);
            _mm_store_ps(outptr, _p);
            ptr0 += 4;
            outptr += 4;
        }
        for (int x = 0; x < right; x++)
        {
            __m128 _p = _mm_load_ps(ptr0 - 8 - x * 4);
            _mm_store_ps(outptr, _p);
            outptr += 4;
        }
        ptr -= src.w * 4;
    }
    // fill center
    for (int y = 0; y < src.h; y++)
    {
        for (int x = 0; x < left; x++)
        {
            __m128 _p = _mm_load_ps(ptr + (left - x) * 4);
            _mm_store_ps(outptr, _p);
            outptr += 4;
        }
        for (int x = 0; x < src.w; x++)
        {
            __m128 _p = _mm_load_ps(ptr);
            _mm_store_ps(outptr, _p);
            ptr += 4;
            outptr += 4;
        }
        for (int x = 0; x < right; x++)
        {
            __m128 _p = _mm_load_ps(ptr - 8 - x * 4);
            _mm_store_ps(outptr, _p);
            outptr += 4;
        }
    }
    // fill bottom
    ptr -= 2 * src.w * 4;
    for (int y = 0; y < bottom; y++)
    {
        const float* ptr0 = ptr;
        for (int x = 0; x < left; x++)
        {
            __m128 _p = _mm_load_ps(ptr0 + (left - x) * 4);
            _mm_store_ps(outptr, _p);
            outptr += 4;
        }
        for (int x = 0; x < src.w; x++)
        {
            __m128 _p = _mm_load_ps(ptr0);
            _mm_store_ps(outptr, _p);
            ptr0 += 4;
            outptr += 4;
        }
        for (int x = 0; x < right; x++)
        {
            __m128 _p = _mm_load_ps(ptr0 - 8 - x * 4);
            _mm_store_ps(outptr, _p);
            outptr += 4;
        }
        ptr -= src.w * 4;
    }
}